

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O2

unsigned_short tinyexr::reverseLutFromBitmap(uchar *bitmap,unsigned_short *lut)

{
  int iVar1;
  int i;
  long lVar2;
  
  i = 0;
  iVar1 = 0;
  do {
    if (i == 0) {
LAB_001213cb:
      lVar2 = (long)iVar1;
      iVar1 = iVar1 + 1;
      lut[lVar2] = (unsigned_short)i;
    }
    else {
      if (i == 0x10000) {
        for (lVar2 = (long)iVar1; lVar2 < 0x10000; lVar2 = lVar2 + 1) {
          lut[lVar2] = 0;
        }
        return (short)iVar1 - 1;
      }
      if ((bitmap[(uint)i >> 3] >> (i & 7U) & 1) != 0) goto LAB_001213cb;
    }
    i = i + 1;
  } while( true );
}

Assistant:

unsigned short reverseLutFromBitmap(const unsigned char bitmap[BITMAP_SIZE],
                                    unsigned short lut[USHORT_RANGE]) {
  int k = 0;

  for (int i = 0; i < USHORT_RANGE; ++i) {
    if ((i == 0) || (bitmap[i >> 3] & (1 << (i & 7)))) lut[k++] = i;
  }

  int n = k - 1;

  while (k < USHORT_RANGE) lut[k++] = 0;

  return n;  // maximum k where lut[k] is non-zero,
}